

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O0

void __thiscall
duckdb::PositionalJoinGlobalState::~PositionalJoinGlobalState(PositionalJoinGlobalState *this)

{
  PositionalJoinGlobalState *in_RDI;
  
  ~PositionalJoinGlobalState(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit PositionalJoinGlobalState(ClientContext &context, const PhysicalPositionalJoin &op)
	    : rhs(context, op.children[1].get().GetTypes()), initialized(false), source_offset(0), exhausted(false) {
		rhs.InitializeAppend(append_state);
	}